

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O3

ssize_t __thiscall
kj::VectorOutputStream::write(VectorOutputStream *this,int __fd,void *__buf,size_t __n)

{
  byte **params_1;
  size_t sVar1;
  uchar *puVar2;
  undefined4 in_register_00000034;
  byte *__src;
  byte *__dest;
  Fault f;
  size_t size_local;
  uchar *local_28;
  
  __src = (byte *)CONCAT44(in_register_00000034,__fd);
  params_1 = &this->fillPos;
  __dest = this->fillPos;
  puVar2 = (this->vector).ptr;
  sVar1 = (this->vector).size_;
  size_local = (size_t)__buf;
  if ((__dest == __src) && (local_28 = puVar2 + (sVar1 - (long)__src), local_28 != (uchar *)0x0)) {
    if (local_28 < __buf) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_long&,unsigned_char*&,long>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/io.c++"
                 ,0x130,FAILED,"size <= vector.end() - fillPos",
                 "size, fillPos, vector.end() - fillPos",&size_local,params_1,(long *)&local_28);
      kj::_::Debug::Fault::fatal(&f);
    }
  }
  else {
    if (puVar2 + (sVar1 - (long)__dest) < __buf) {
      grow(this,(long)(__dest + (long)__buf) - (long)puVar2);
      __dest = this->fillPos;
    }
    puVar2 = (uchar *)memcpy(__dest,__src,(size_t)__buf);
    __dest = *params_1;
  }
  *params_1 = __dest + (long)__buf;
  return (ssize_t)puVar2;
}

Assistant:

void VectorOutputStream::write(const void* src, size_t size) {
  if (src == fillPos && fillPos != vector.end()) {
    // Oh goody, the caller wrote directly into our buffer.
    KJ_REQUIRE(size <= vector.end() - fillPos, size, fillPos, vector.end() - fillPos);
    fillPos += size;
  } else {
    if (vector.end() - fillPos < size) {
      grow(fillPos - vector.begin() + size);
    }

    memcpy(fillPos, src, size);
    fillPos += size;
  }
}